

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QPodArrayOps<char>::insert
          (QPodArrayOps<char> *this,qsizetype i,qsizetype n,parameter_type t)

{
  char *__s;
  bool bVar1;
  
  bVar1 = i == 0 && (this->super_QArrayDataPointer<char>).size != 0;
  QArrayDataPointer<char>::detachAndGrow
            (&this->super_QArrayDataPointer<char>,(uint)bVar1,n,(char **)0x0,
             (QArrayDataPointer<char> *)0x0);
  __s = createHole(this,(uint)bVar1,i,n);
  if (n != 0) {
    memset(__s,(uint)(byte)t,n);
    return;
  }
  return;
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        typename Data::GrowthPosition pos = Data::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = Data::GrowsAtBeginning;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        T *where = createHole(pos, i, n);
        while (n--)
            *where++ = copy;
    }